

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_decode_tiles
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  OPJ_BYTE *ptr;
  OPJ_BYTE *p_data;
  OPJ_OFF_T OVar2;
  int iVar3;
  uint uVar4;
  OPJ_UINT32 l_current_tile_no;
  OPJ_UINT32 l_data_size;
  OPJ_UINT32 local_4c;
  OPJ_BOOL l_go_on;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  
  l_go_on = 1;
  ptr = (OPJ_BYTE *)opj_malloc(1000);
  if (ptr == (OPJ_BYTE *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory to decode tiles\n");
    return 0;
  }
  local_4c = 1000;
  iVar3 = 0;
  do {
    OVar1 = opj_j2k_read_tile_header
                      (p_j2k,&l_current_tile_no,&l_data_size,&l_tile_x0,&l_tile_y0,&l_tile_x1,
                       &l_tile_y1,&l_nb_comps,&l_go_on,p_stream,p_manager);
    p_data = ptr;
    if (OVar1 == 0) {
LAB_00114734:
      opj_free(p_data);
      return 0;
    }
    if (l_go_on == 0) {
LAB_0011470b:
      opj_free(p_data);
      return 1;
    }
    if (local_4c < l_data_size) {
      p_data = (OPJ_BYTE *)opj_realloc(ptr,(ulong)l_data_size);
      if (p_data == (OPJ_BYTE *)0x0) {
        opj_free(ptr);
        opj_event_msg(p_manager,1,"Not enough memory to decode tile %d/%d\n",
                      (ulong)(l_current_tile_no + 1),(ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
        return 0;
      }
      local_4c = l_data_size;
    }
    OVar1 = opj_j2k_decode_tile(p_j2k,l_current_tile_no,p_data,l_data_size,p_stream,p_manager);
    if (OVar1 == 0) {
      opj_free(p_data);
      opj_event_msg(p_manager,1,"Failed to decode tile %d/%d\n",(ulong)(l_current_tile_no + 1),
                    (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
      return 0;
    }
    uVar4 = l_current_tile_no + 1;
    opj_event_msg(p_manager,4,"Tile %d/%d has been decoded.\n",(ulong)uVar4,
                  (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
    OVar1 = opj_j2k_update_image_data(p_j2k->m_tcd,p_data,p_j2k->m_output_image);
    if (OVar1 == 0) goto LAB_00114734;
    opj_event_msg(p_manager,4,"Image data has been updated with tile %d.\n\n",(ulong)uVar4);
    OVar2 = opj_stream_get_number_byte_left(p_stream);
    if (((OVar2 == 0) && ((p_j2k->m_specific_param).m_decoder.m_state == 0x40)) ||
       (iVar3 = iVar3 + 1, ptr = p_data, iVar3 == (p_j2k->m_cp).tw * (p_j2k->m_cp).th))
    goto LAB_0011470b;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_j2k_decode_tiles ( opj_j2k_t *p_j2k,
                                                            opj_stream_private_t *p_stream,
                                                            opj_event_mgr_t * p_manager)
{
        OPJ_BOOL l_go_on = OPJ_TRUE;
        OPJ_UINT32 l_current_tile_no;
        OPJ_UINT32 l_data_size,l_max_data_size;
        OPJ_INT32 l_tile_x0,l_tile_y0,l_tile_x1,l_tile_y1;
        OPJ_UINT32 l_nb_comps;
        OPJ_BYTE * l_current_data;
        OPJ_UINT32 nr_tiles = 0;

        l_current_data = (OPJ_BYTE*)opj_malloc(1000);
        if (! l_current_data) {
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tiles\n");
                return OPJ_FALSE;
        }
        l_max_data_size = 1000;

		for (;;) {
                if (! opj_j2k_read_tile_header( p_j2k,
                                        &l_current_tile_no,
                                        &l_data_size,
                                        &l_tile_x0, &l_tile_y0,
                                        &l_tile_x1, &l_tile_y1,
                                        &l_nb_comps,
                                        &l_go_on,
                                        p_stream,
                                        p_manager)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }

                if (! l_go_on) {
                        break;
                }

                if (l_data_size > l_max_data_size) {
                        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_data_size);
                        if (! l_new_current_data) {
                                opj_free(l_current_data);
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                                return OPJ_FALSE;
                        }
                        l_current_data = l_new_current_data;
                        l_max_data_size = l_data_size;
                }

                if (! opj_j2k_decode_tile(p_j2k,l_current_tile_no,l_current_data,l_data_size,p_stream,p_manager)) {
                        opj_free(l_current_data);
                        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile %d/%d\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n", l_current_tile_no +1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

                if (! opj_j2k_update_image_data(p_j2k->m_tcd,l_current_data, p_j2k->m_output_image)) {
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                }
                opj_event_msg(p_manager, EVT_INFO, "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);
                
                if(opj_stream_get_number_byte_left(p_stream) == 0  
                    && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC)
                    break;
                if(++nr_tiles ==  p_j2k->m_cp.th * p_j2k->m_cp.tw) 
                    break;
        }

        opj_free(l_current_data);

        return OPJ_TRUE;
}